

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O3

void __thiscall
ParseNodeRegExp::ParseNodeRegExp
          (ParseNodeRegExp *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  (this->super_ParseNode).nop = nop;
  (this->super_ParseNode).grfpn = 0;
  (this->super_ParseNode).location = 0xffffffff;
  (this->super_ParseNode).field_0x1 = ((this->super_ParseNode).field_0x1 & 0xe0) + 1;
  (this->super_ParseNode).ichMin = ichMin;
  (this->super_ParseNode).ichLim = ichLim;
  this->regexPattern = (RegexPattern *)0x0;
  this->regexPatternIndex = 0;
  return;
}

Assistant:

ParseNodeRegExp::ParseNodeRegExp(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNode(nop, ichMin, ichLim)
{
    this->regexPattern = nullptr;
    this->regexPatternIndex = 0;
}